

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int katherine_set_dacs(katherine_device_t *device,katherine_dacs_t *dacs)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int5 *piVar4;
  long lVar5;
  char ack [8];
  int5 local_40;
  undefined3 uStack_3b;
  undefined8 local_38;
  
  iVar2 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar2 == 0) {
    lVar5 = 0;
    do {
      _local_40 = CONCAT35(0x400,(uint5)(byte)lVar5 << 0x20);
      uVar3 = (ulong)dacs->array[lVar5];
      piVar4 = &local_40;
      if (uVar3 != 0) {
        do {
          *(char *)piVar4 = (char)uVar3;
          bVar1 = 0xff < uVar3;
          piVar4 = (int5 *)((long)piVar4 + 1);
          uVar3 = uVar3 >> 8;
        } while (bVar1);
      }
      iVar2 = katherine_udp_send_exact(&device->control_socket,&local_40,8);
      if ((iVar2 != 0) ||
         (iVar2 = katherine_udp_recv_exact(&device->control_socket,&local_38,8), iVar2 != 0))
      goto LAB_001043a3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x12);
    local_38 = 0x7000000000001;
    iVar2 = katherine_udp_send_exact(&device->control_socket,&local_38,8);
    if (iVar2 == 0) {
      iVar2 = katherine_udp_recv_exact(&device->control_socket,&local_38,8);
    }
  }
LAB_001043a3:
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar2;
}

Assistant:

int
katherine_set_dacs(katherine_device_t *device, const katherine_dacs_t *dacs)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    for (int i = 0; i < 18; ++i) {
        char cmd[8] = {0};
        cmd[6] = CMD_TYPE_INTERNAL_DAC_SETTINGS;
        cmd[4] = (char) i;
        katherine_cmd_long(cmd, dacs->array[i]);

        res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
        if (res) goto err;

        res = katherine_cmd_wait_ack(&device->control_socket);
        if (res) goto err;
    }

    res = katherine_cmd_hw_internal_dac_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}